

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readme_examples.c
# Opt level: O0

void create_monitor_should_create_a_monitor(void)

{
  char *expected;
  char *monitor;
  
  expected = create_monitor();
  UnityAssertEqualString(expected,json,(char *)0x0,0xdd);
  free(expected);
  return;
}

Assistant:

static void create_monitor_should_create_a_monitor(void)
{
    char *monitor = create_monitor();

    TEST_ASSERT_EQUAL_STRING(monitor, json);

    free(monitor);
}